

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall Instance::enforceConstraints(Instance *this)

{
  bool bVar1;
  iterator this_00;
  expr *in_RDI;
  expr constraint;
  iterator __end1;
  iterator __begin1;
  vector<z3::expr,_std::allocator<z3::expr>_> *__range1;
  vector<z3::expr,_std::allocator<z3::expr>_> *in_stack_ffffffffffffffa8;
  expr *in_stack_ffffffffffffffb0;
  optimize *in_stack_ffffffffffffffc0;
  expr local_30;
  __normal_iterator<z3::expr_*,_std::vector<z3::expr,_std::allocator<z3::expr>_>_> local_18;
  Z3_ast *local_10;
  
  local_10 = &in_RDI[0x19].super_ast.m_ast;
  local_18._M_current =
       (expr *)std::vector<z3::expr,_std::allocator<z3::expr>_>::begin(in_stack_ffffffffffffffa8);
  this_00 = std::vector<z3::expr,_std::allocator<z3::expr>_>::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<z3::expr_*,_std::vector<z3::expr,_std::allocator<z3::expr>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<z3::expr_*,_std::vector<z3::expr,_std::allocator<z3::expr>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<z3::expr_*,_std::vector<z3::expr,_std::allocator<z3::expr>_>_>::
    operator*(&local_18);
    in_stack_ffffffffffffffb0 = &local_30;
    z3::expr::expr(in_stack_ffffffffffffffb0,(expr *)in_stack_ffffffffffffffa8);
    z3::optimize::add(in_stack_ffffffffffffffc0,in_RDI);
    z3::expr::~expr((expr *)0x1071ff);
    __gnu_cxx::__normal_iterator<z3::expr_*,_std::vector<z3::expr,_std::allocator<z3::expr>_>_>::
    operator++(&local_18);
  }
  (**(code **)((in_RDI->super_ast).super_object.m_ctx + 1))();
  (*(code *)((in_RDI->super_ast).super_object.m_ctx)->m_ctx)();
  minimizeVss((Instance *)this_00._M_current);
  return;
}

Assistant:

void Instance::enforceConstraints() {
  for (expr constraint : constraints)
    solver.add(constraint);

  enforceStopConstraint();
  enforceBoundaryConstraints();
  minimizeVss();
}